

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_1U>::getUNORMPacked
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_char,_1U> *this,uint32_t c0,uint32_t c1,uint32_t c2,uint32_t c3)

{
  pointer puVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool packC3;
  bool packC2;
  bool packC1;
  bool packC0;
  uint8_t pack;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  anon_class_72_9_1f7fd2b6 copy;
  undefined1 local_b4;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  unsigned_long local_b0;
  uint local_a4;
  ulong local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_98;
  uint32_t local_90;
  uint32_t local_8c;
  uint32_t local_88;
  uint32_t local_84;
  ulong local_80;
  undefined1 *local_78;
  Color *local_70;
  uint32_t *local_68;
  uint32_t *local_60;
  uint32_t *local_58;
  uint32_t *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  uVar5 = c2 + c3 + c1 + c0;
  local_98 = __return_storage_ptr__;
  local_90 = c3;
  local_8c = c2;
  local_88 = c1;
  local_84 = c0;
  if ((uVar5 & 7) != 0) {
    __assert_fail("(c0 + c1 + c2 + c3) % 8 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x347,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 1>::getUNORMPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 1]"
                 );
  }
  local_a4 = uVar5 - 8 >> 3;
  if ((local_a4 < 8) && ((0x8bU >> (local_a4 & 0x1f) & 1) != 0)) {
    local_b1 = c0 != 0;
    local_b2 = c1 != 0;
    local_b3 = c2 != 0;
    local_b4 = c3 != 0;
    if ((byte)(local_b4 + local_b2 + local_b1 + local_b3) < 2) {
      local_a0 = (ulong)(uVar5 >> 3);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (__return_storage_ptr__,
                 (ulong)((this->super_Image).height * (uVar5 >> 3) * (this->super_Image).width),
                 (allocator_type *)&local_78);
      if ((this->super_Image).height != 0) {
        uVar6 = 0;
        local_80 = (ulong)local_a4;
        uVar2 = local_a0;
        uVar5 = local_a4;
        do {
          uVar4 = (this->super_Image).width;
          if (uVar4 != 0) {
            uVar3 = 0;
            do {
              uVar4 = uVar4 * uVar6 + uVar3;
              local_70 = this->pixels + uVar4;
              local_78 = &local_b1;
              puVar1 = (local_98->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                       ._M_impl.super__Vector_impl_data._M_start;
              local_68 = &local_84;
              local_60 = &local_88;
              local_58 = &local_8c;
              local_50 = &local_90;
              local_48 = &local_b2;
              local_40 = &local_b3;
              local_38 = &local_b4;
              if (uVar5 < 8) {
                uVar4 = uVar4 * (int)uVar2;
                switch((long)&switchD_00198c3d::switchdataD_0020d950 +
                       (long)(int)(&switchD_00198c3d::switchdataD_0020d950)[local_80]) {
                case 0x198c3f:
                  local_b0 = local_b0 & 0xffffffffffffff00;
                  const::{lambda(auto:1&)#1}::operator()
                            ((_lambda_auto_1___1_ *)&local_78,(uchar *)&local_b0);
                  puVar1[uVar4] = (uchar)local_b0;
                  uVar2 = local_a0;
                  uVar5 = local_a4;
                  break;
                case 0x198c66:
                  local_b0 = local_b0 & 0xffffffff00000000;
                  const::{lambda(auto:1&)#1}::operator()
                            ((_lambda_auto_1___1_ *)&local_78,(uint *)&local_b0);
                  *(undefined4 *)(puVar1 + uVar4) = (undefined4)local_b0;
                  uVar2 = local_a0;
                  uVar5 = local_a4;
                  break;
                case 0x198c90:
                  local_b0 = local_b0 & 0xffffffffffff0000;
                  const::{lambda(auto:1&)#1}::operator()
                            ((_lambda_auto_1___1_ *)&local_78,(unsigned_short *)&local_b0);
                  *(undefined2 *)(puVar1 + uVar4) = (undefined2)local_b0;
                  uVar2 = local_a0;
                  uVar5 = local_a4;
                  break;
                case 0x198cbb:
                  local_b0 = 0;
                  const::{lambda(auto:1&)#1}::operator()((_lambda_auto_1___1_ *)&local_78,&local_b0)
                  ;
                  *(unsigned_long *)(puVar1 + uVar4) = local_b0;
                  uVar2 = local_a0;
                  uVar5 = local_a4;
                }
              }
              uVar3 = uVar3 + 1;
              uVar4 = (this->super_Image).width;
            } while (uVar3 < uVar4);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < (this->super_Image).height);
      }
      return local_98;
    }
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x34f,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 1>::getUNORMPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 1]"
                 );
  }
  __assert_fail("targetPackBytes == 1 || targetPackBytes == 2 || targetPackBytes == 4 || targetPackBytes == 8"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x349,
                "virtual std::vector<uint8_t> ImageT<unsigned char, 1>::getUNORMPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 1]"
               );
}

Assistant:

virtual std::vector<uint8_t> getUNORMPacked(
            uint32_t c0, uint32_t c1, uint32_t c2, uint32_t c3) const override {
        assert((c0 + c1 + c2 + c3) % 8 == 0);
        const auto targetPackBytes = (c0 + c1 + c2 + c3) / 8;
        assert(targetPackBytes == 1 || targetPackBytes == 2 || targetPackBytes == 4 || targetPackBytes == 8);
        const auto packC0 = c0 > 0;
        const auto packC1 = c1 > 0;
        const auto packC2 = c2 > 0;
        const auto packC3 = c3 > 0;
        const auto numChannels = (packC0 ? 1u : 0) + (packC1 ? 1u : 0) + (packC2 ? 1u : 0) + (packC3 ? 1u : 0);
        assert(numChannels <= componentCount); (void) numChannels;
        const uint32_t sourceBits = sizeof(componentType) * 8;
        static constexpr auto hasC0 = componentCount > 0;
        static constexpr auto hasC1 = componentCount > 1;
        static constexpr auto hasC2 = componentCount > 2;
        static constexpr auto hasC3 = componentCount > 3;

        std::vector<uint8_t> data(height * width * targetPackBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                const auto& pixel = pixels[y * width + x];
                auto* target = data.data() + (y * width + x) * targetPackBytes;

                const auto copy = [&](auto& pack) {
                    using PackType = std::remove_reference_t<decltype(pack)>;

                    if (packC0) {
                        const auto sourceValue = hasC0 ? pixel[0] : componentType{0};
                        const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, c0);
                        pack |= static_cast<PackType>(value) << (c1 + c2 + c3);
                    }
                    if (packC1) {
                        const auto sourceValue = hasC1 ? pixel[1] : componentType{0};
                        const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, c1);
                        pack |= static_cast<PackType>(value) << (c2 + c3);
                    }
                    if (packC2) {
                        const auto sourceValue = hasC2 ? pixel[2] : componentType{0};
                        const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, c2);
                        pack |= static_cast<PackType>(value) << c3;
                    }
                    if (packC3) {
                        const auto sourceValue = hasC3 ? pixel[3] : Color::one();
                        const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, c3);
                        pack |= static_cast<PackType>(value);
                    }
                };

                if (targetPackBytes == 1) {
                    uint8_t pack = 0;
                    copy(pack);
                    std::memcpy(target, &pack, sizeof(pack));
                } else if (targetPackBytes == 2) {
                    uint16_t pack = 0;
                    copy(pack);
                    std::memcpy(target, &pack, sizeof(pack));
                } else if (targetPackBytes == 4) {
                    uint32_t pack = 0;
                    copy(pack);
                    std::memcpy(target, &pack, sizeof(pack));
                } else if (targetPackBytes == 8) {
                    uint64_t pack = 0;
                    copy(pack);
                    std::memcpy(target, &pack, sizeof(pack));
                }
            }
        }

        return data;
    }